

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::dzeroless(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  
  requireDStackDepth(this,2,"D0<");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::getTop(this_00,1);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,0,(&this->False)[uVar1 >> 0x1f]);
  return;
}

Assistant:

void dzeroless(){
			REQUIRE_DSTACK_DEPTH(2, "D0<");
			DCell d1(dStack.getTop(1), dStack.getTop());
			auto result = d1.data_.SDcells<0;
			dStack.pop();
			dStack.setTop(0, result? True : False);
		}